

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_template_class.cpp
# Opt level: O0

void use_template_class(void)

{
  bool bVar1;
  istream *piVar2;
  byte local_52;
  undefined1 local_38 [8];
  string str;
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> ss;
  
  L14_4::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Stack((Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        ((long)&str.field_2 + 8),10);
  std::__cxx11::string::string((string *)local_38);
  std::operator<<((ostream *)&std::cout,"Please add something to stack(q to quit):\n");
  while( true ) {
    piVar2 = std::operator>>((istream *)&std::cin,(string *)local_38);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    local_52 = 0;
    if (bVar1) {
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"q");
      local_52 = 0;
      if (bVar1) {
        bVar1 = L14_4::
                Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::is_full((Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)((long)&str.field_2 + 8));
        local_52 = bVar1 ^ 0xff;
      }
    }
    if ((local_52 & 1) == 0) break;
    L14_4::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push((Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
         ((long)&str.field_2 + 8),
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    std::operator<<((ostream *)&std::cout,"then again with stack(q to quit):\n");
  }
  bVar1 = L14_4::
          Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          is_full((Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)((long)&str.field_2 + 8));
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"stack is full.\n");
  }
  else {
    std::operator<<((ostream *)&std::cout,"ok, leave stack...\n");
  }
  std::__cxx11::string::~string((string *)local_38);
  L14_4::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Stack((Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
         ((long)&str.field_2 + 8));
  return;
}

Assistant:

void use_template_class() {
    using namespace L14_4;

    // string stack
    Stack<std::string> ss;
    std::string str;

    std::cout << "Please add something to stack(q to quit):\n";
    while(std::cin >> str && str != "q" && !ss.is_full()) {
        ss.push(str);
        std::cout << "then again with stack(q to quit):\n";
    }
    if (ss.is_full()) {
        std::cout << "stack is full.\n";
    } else {
        std::cout << "ok, leave stack...\n";
    }
}